

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_create(REF_ADJ *ref_adj_ptr)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uStack_20;
  
  pRVar1 = (REF_ADJ)malloc(0x20);
  *ref_adj_ptr = pRVar1;
  if (pRVar1 == (REF_ADJ)0x0) {
    pcVar5 = "malloc *ref_adj_ptr of REF_ADJ_STRUCT NULL";
    uStack_20 = 0x1f;
  }
  else {
    pRVar1->nnode = 10;
    pRVar1->nitem = 0x14;
    pRVar2 = (REF_INT *)malloc(0x28);
    pRVar1->first = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
      pcVar5 = "malloc ref_adj->first of REF_INT NULL";
      uStack_20 = 0x25;
    }
    else {
      for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
        pRVar2[lVar4] = -1;
      }
      pRVar3 = (REF_ADJ_ITEM)malloc(0xa0);
      pRVar1->item = pRVar3;
      if (pRVar3 != (REF_ADJ_ITEM)0x0) {
        lVar4 = 0;
        while (lVar4 != 0x14) {
          pRVar3[lVar4].ref = -1;
          pRVar3[lVar4].next = (REF_INT)(lVar4 + 1);
          lVar4 = lVar4 + 1;
        }
        pRVar3[0x13].next = -1;
        pRVar1->blank = 0;
        return 0;
      }
      pcVar5 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT NULL";
      uStack_20 = 0x28;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uStack_20,
         "ref_adj_create",pcVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_create(REF_ADJ *ref_adj_ptr) {
  REF_ADJ ref_adj;
  REF_INT i;

  ref_malloc(*ref_adj_ptr, 1, REF_ADJ_STRUCT);
  ref_adj = (*ref_adj_ptr);

  ref_adj_nnode(ref_adj) = 10;
  ref_adj_nitem(ref_adj) = 20;

  ref_malloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
  for (i = 0; i < ref_adj_nnode(ref_adj); i++) ref_adj->first[i] = REF_EMPTY;

  ref_malloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
  for (i = 0; i < ref_adj_nitem(ref_adj); i++) {
    ref_adj->item[i].ref = REF_EMPTY;
    ref_adj->item[i].next = i + 1;
  }
  ref_adj->item[ref_adj_nitem(ref_adj) - 1].next = REF_EMPTY;
  ref_adj->blank = 0;

  return REF_SUCCESS;
}